

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::SetMaximumPacketSize(RTPUDPv4Transmitter *this,size_t s)

{
  size_t s_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x59;
  }
  else if (s < 0x10000) {
    this->maxpacksize = s;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0x5d;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (s > RTPUDPV4TRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_SPECIFIEDSIZETOOBIG;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}